

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

wstring * __thiscall
mjs::strip_format_control_characters_abi_cxx11_
          (wstring *__return_storage_ptr__,mjs *this,wstring_view *s)

{
  long lVar1;
  long lVar2;
  classification cVar3;
  long lVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
  lVar1 = *(long *)this;
  if (lVar1 != 0) {
    lVar2 = *(long *)(this + 8);
    lVar4 = 0;
    do {
      if ((*(uint *)(lVar2 + lVar4) < 0xad) ||
         (cVar3 = anon_unknown_2::classify(*(uint *)(lVar2 + lVar4)), cVar3 != format)) {
        std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
      }
      lVar4 = lVar4 + 4;
    } while (lVar1 << 2 != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring strip_format_control_characters(const std::wstring_view& s) {
    std::wstring res;
    res.reserve(s.size());
    std::copy_if(s.begin(), s.end(), std::back_inserter(res), [](auto ch) { return !is_form_control(ch); });
    return res;
}